

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O0

bool __thiscall gtar::Record::operator<(Record *this,Record *rhs)

{
  Behavior a;
  Format a_00;
  Behavior b;
  Format b_00;
  Resolution a_01;
  Resolution b_01;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Record *local_18;
  Record *rhs_local;
  Record *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  std::__cxx11::string::string((string *)&local_38,(string *)this);
  std::__cxx11::string::string((string *)&local_58,(string *)local_18);
  std::__cxx11::string::string((string *)&local_88,(string *)&this->m_name);
  std::__cxx11::string::string((string *)&local_a8,(string *)&local_18->m_name);
  a = this->m_behavior;
  a_00 = this->m_format;
  b = local_18->m_behavior;
  b_00 = local_18->m_format;
  a_01 = this->m_resolution;
  b_01 = local_18->m_resolution;
  bVar1 = std::operator<(&this->m_index,&local_18->m_index);
  bVar1 = lthelper<gtar::Resolution>(a_01,b_01,bVar1);
  bVar1 = lthelper<gtar::Format>(a_00,b_00,bVar1);
  bVar1 = lthelper<gtar::Behavior>(a,b,bVar1);
  bVar1 = lthelper<std::__cxx11::string>(&local_88,&local_a8,bVar1);
  bVar1 = lthelper<std::__cxx11::string>(&local_38,&local_58,bVar1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool Record::operator<(const Record &rhs) const
    {
        return lthelper(m_group, rhs.m_group,
               lthelper(m_name, rhs.m_name,
               lthelper(m_behavior, rhs.m_behavior,
               lthelper(m_format, rhs.m_format,
               lthelper(m_resolution, rhs.m_resolution,
                        m_index < rhs.m_index)))));
    }